

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::TextureUnitCase::~TextureUnitCase(TextureUnitCase *this)

{
  ~TextureUnitCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

TextureUnitCase::~TextureUnitCase (void)
{
	TextureUnitCase::deinit();
}